

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CupdlpWrapper.cpp
# Opt level: O1

void analysePdlpSolution(HighsOptions *options,HighsLp *lp,HighsSolution *highs_solution)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double *pdVar6;
  uint uVar7;
  double *pdVar8;
  int iVar9;
  double *pdVar10;
  long lVar11;
  char *pcVar12;
  long lVar13;
  uint uVar14;
  double *pdVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  undefined1 auVar26 [16];
  undefined8 local_58;
  undefined8 uStack_50;
  
  if (0 < lp->num_col_) {
    uVar16 = 0;
    do {
      printf("x[%2d] = %11.5g\n",
             (highs_solution->col_value).super__Vector_base<double,_std::allocator<double>_>._M_impl
             .super__Vector_impl_data._M_start[uVar16],uVar16 & 0xffffffff);
      uVar16 = uVar16 + 1;
    } while ((long)uVar16 < (long)lp->num_col_);
  }
  uVar7 = lp->num_row_;
  if (0 < (int)uVar7) {
    uVar16 = 0;
    do {
      printf("y[%2d] = %11.5g\n",
             (highs_solution->row_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar16],uVar16 & 0xffffffff);
      uVar16 = uVar16 + 1;
      uVar7 = lp->num_row_;
    } while ((long)uVar16 < (long)(int)uVar7);
  }
  dVar21 = (options->super_HighsOptionsStruct).primal_feasibility_tolerance;
  dVar19 = (options->super_HighsOptionsStruct).dual_feasibility_tolerance;
  if ((long)lp->num_col_ < 1) {
    uVar18 = 0;
    dVar24 = 0.0;
    dVar25 = 0.0;
    uVar14 = 0;
    auVar26 = ZEXT816(0);
  }
  else {
    dVar24 = 0.0;
    dVar25 = 0.0;
    lVar13 = 0;
    uVar14 = 0;
    uVar18 = 0;
    auVar26 = ZEXT816(0);
    do {
      dVar1 = (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar13];
      dVar2 = (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar13];
      dVar3 = (highs_solution->col_value).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar13];
      if (dVar1 - dVar21 <= dVar3) {
        dVar20 = 0.0;
        if (dVar21 + dVar2 < dVar3) {
          dVar20 = dVar3 - dVar2;
        }
      }
      else {
        dVar20 = dVar1 - dVar3;
      }
      dVar22 = (highs_solution->col_dual).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar13] * (double)lp->sense_;
      dVar23 = ABS(dVar2 - dVar3);
      if (ABS(dVar1 - dVar3) <= ABS(dVar2 - dVar3)) {
        dVar23 = ABS(dVar1 - dVar3);
      }
      if (dVar23 <= dVar21) {
        dVar23 = 0.0;
        if (dVar1 < dVar2) {
          if (dVar3 < (dVar1 + dVar2) * 0.5) {
            dVar22 = -dVar22;
          }
          if (0.0 <= dVar22) {
            dVar23 = dVar22;
          }
        }
      }
      else {
        dVar23 = ABS(dVar22);
      }
      uVar18 = uVar18 + (dVar21 < dVar20);
      uVar14 = uVar14 + (dVar19 < dVar23);
      auVar4._8_8_ = dVar23;
      auVar4._0_8_ = dVar20;
      auVar26 = maxpd(auVar26,auVar4);
      dVar24 = dVar24 + dVar20;
      dVar25 = dVar25 + dVar23;
      lVar13 = lVar13 + 1;
    } while (lp->num_col_ != lVar13);
  }
  if (0 < (int)uVar7) {
    uVar16 = 0;
    do {
      dVar1 = (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar16];
      dVar2 = (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar16];
      dVar3 = (highs_solution->row_value).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar16];
      if (dVar1 - dVar21 <= dVar3) {
        dVar20 = 0.0;
        if (dVar21 + dVar2 < dVar3) {
          dVar20 = dVar3 - dVar2;
        }
      }
      else {
        dVar20 = dVar1 - dVar3;
      }
      dVar22 = (highs_solution->row_dual).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar16] * (double)lp->sense_;
      dVar23 = ABS(dVar2 - dVar3);
      if (ABS(dVar1 - dVar3) <= ABS(dVar2 - dVar3)) {
        dVar23 = ABS(dVar1 - dVar3);
      }
      if (dVar23 <= dVar21) {
        dVar23 = 0.0;
        if (dVar1 < dVar2) {
          if (dVar3 < (dVar1 + dVar2) * 0.5) {
            dVar22 = -dVar22;
          }
          if (0.0 <= dVar22) {
            dVar23 = dVar22;
          }
        }
      }
      else {
        dVar23 = ABS(dVar22);
      }
      uVar18 = uVar18 + (dVar21 < dVar20);
      uVar14 = uVar14 + (dVar19 < dVar23);
      auVar5._8_8_ = dVar23;
      auVar5._0_8_ = dVar20;
      auVar26 = maxpd(auVar26,auVar5);
      dVar24 = dVar24 + dVar20;
      dVar25 = dVar25 + dVar23;
      uVar16 = uVar16 + 1;
    } while (uVar7 != uVar16);
  }
  uVar7 = lp->num_col_;
  uVar16 = (ulong)uVar7;
  iVar9 = lp->num_row_ + uVar7;
  dVar21 = 0.0;
  if (iVar9 != 0 && SCARRY4(lp->num_row_,uVar7) == iVar9 < 0) {
    lVar13 = 0;
    uVar17 = 0;
    do {
      lVar11 = (long)(int)uVar16;
      uVar7 = (int)uVar17 - (int)uVar16;
      pdVar8 = (highs_solution->row_dual).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start + (int)uVar7;
      pdVar6 = (highs_solution->row_value).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start + (int)uVar7;
      if ((long)uVar17 < lVar11) {
        pdVar8 = (double *)
                 ((long)(highs_solution->col_dual).
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar13);
        pdVar6 = (double *)
                 ((long)(highs_solution->col_value).
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar13);
      }
      pdVar15 = (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + (int)uVar7;
      if ((long)uVar17 < lVar11) {
        pdVar15 = (double *)
                  ((long)(lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar13);
      }
      pdVar10 = (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + (int)uVar7;
      if ((long)uVar17 < lVar11) {
        pdVar10 = (double *)
                  ((long)(lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar13);
      }
      uVar16 = -(ulong)(*pdVar6 < (*pdVar15 + *pdVar10) * 0.5);
      dVar19 = ABS(*pdVar8) *
               ABS((double)(~uVar16 & (ulong)*pdVar10 | uVar16 & (ulong)*pdVar15) - *pdVar6);
      pcVar12 = "Row   ";
      if (dVar21 <= dVar19) {
        dVar21 = dVar19;
      }
      if ((long)uVar17 < lVar11) {
        pcVar12 = "Column";
      }
      uVar16 = (ulong)uVar7;
      if ((long)uVar17 < lVar11) {
        uVar16 = uVar17 & 0xffffffff;
      }
      printf("%s %2d [%11.5g, %11.5g, %11.5g] has (primal_residual, dual) values (%11.6g, %11.6g) so complementary_violation = %11.6g\n"
             ,pcVar12,uVar16);
      uVar17 = uVar17 + 1;
      uVar16 = (ulong)lp->num_col_;
      lVar13 = lVar13 + 8;
    } while ((long)uVar17 < (long)((long)lp->num_row_ + uVar16));
  }
  printf("PDLP max complementary violation = %g\n",dVar21);
  local_58 = auVar26._0_8_;
  printf("     primal infeasibilities (%d, %11.6g, %11.6g)\n",dVar24,local_58,(ulong)uVar18);
  uStack_50 = auVar26._8_8_;
  printf("     dual   infeasibilities (%d, %11.6g, %11.6g)\n",dVar25,uStack_50,(ulong)uVar14);
  return;
}

Assistant:

void analysePdlpSolution(const HighsOptions& options, const HighsLp& lp,
                         const HighsSolution& highs_solution) {
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++)
    printf("x[%2d] = %11.5g\n", int(iCol), highs_solution.col_value[iCol]);
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    printf("y[%2d] = %11.5g\n", int(iRow), highs_solution.row_dual[iRow]);
  }

  HighsInt num_primal_infeasibility = 0;
  HighsInt num_dual_infeasibility = 0;
  double max_primal_infeasibility = 0;
  double max_dual_infeasibility = 0;
  double sum_primal_infeasibility = 0;
  double sum_dual_infeasibility = 0;
  const double primal_feasibility_tolerance =
      options.primal_feasibility_tolerance;
  const double dual_feasibility_tolerance = options.dual_feasibility_tolerance;
  double lower;
  double upper;
  double value;
  double dual;
  // lambda for computing infeasibilities
  auto updateInfeasibilities = [&]() {
    double primal_infeasibility = 0;
    double dual_infeasibility = 0;
    // @primal_infeasibility calculation
    if (value < lower - primal_feasibility_tolerance) {
      // Below lower
      primal_infeasibility = lower - value;
    } else if (value > upper + primal_feasibility_tolerance) {
      // Above upper
      primal_infeasibility = value - upper;
    }
    double value_residual =
        std::min(std::fabs(lower - value), std::fabs(value - upper));
    bool at_a_bound = value_residual <= primal_feasibility_tolerance;
    if (at_a_bound) {
      // At a bound
      double middle = (lower + upper) * 0.5;
      if (lower < upper) {
        // Non-fixed variable
        if (value < middle) {
          // At lower
          dual_infeasibility = std::max(-dual, 0.);
        } else {
          // At upper
          dual_infeasibility = std::max(dual, 0.);
        }
      } else {
        // Fixed variable
        dual_infeasibility = 0;
      }
    } else {
      // Off bounds (or free)
      dual_infeasibility = fabs(dual);
    }
    // Accumulate primal infeasibilities
    if (primal_infeasibility > primal_feasibility_tolerance)
      num_primal_infeasibility++;
    max_primal_infeasibility =
        std::max(primal_infeasibility, max_primal_infeasibility);
    sum_primal_infeasibility += primal_infeasibility;
    // Accumulate dual infeasibilities
    if (dual_infeasibility > dual_feasibility_tolerance)
      num_dual_infeasibility++;
    max_dual_infeasibility =
        std::max(dual_infeasibility, max_dual_infeasibility);
    sum_dual_infeasibility += dual_infeasibility;
  };

  // Apply the model sense, as PDLP will have done this
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    lower = lp.col_lower_[iCol];
    upper = lp.col_upper_[iCol];
    value = highs_solution.col_value[iCol];
    dual = int(lp.sense_) * highs_solution.col_dual[iCol];
    updateInfeasibilities();
  }
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    lower = lp.row_lower_[iRow];
    upper = lp.row_upper_[iRow];
    value = highs_solution.row_value[iRow];
    dual = int(lp.sense_) * highs_solution.row_dual[iRow];
    updateInfeasibilities();
  }
  //
  // Determine the sum of complementary violations
  double max_complementary_violation = 0;
  for (HighsInt iVar = 0; iVar < lp.num_col_ + lp.num_row_; iVar++) {
    const bool is_col = iVar < lp.num_col_;
    const HighsInt iRow = iVar - lp.num_col_;
    const double primal = is_col ? highs_solution.col_value[iVar]
                                 : highs_solution.row_value[iRow];
    const double dual =
        is_col ? highs_solution.col_dual[iVar] : highs_solution.row_dual[iRow];
    const double lower = is_col ? lp.col_lower_[iVar] : lp.row_lower_[iRow];
    const double upper = is_col ? lp.col_upper_[iVar] : lp.row_upper_[iRow];
    const double mid = (lower + upper) * 0.5;
    const double primal_residual =
        primal < mid ? std::fabs(lower - primal) : std::fabs(upper - primal);
    const double dual_residual = std::fabs(dual);
    const double complementary_violation = primal_residual * dual_residual;
    max_complementary_violation =
        std::max(complementary_violation, max_complementary_violation);
    printf(
        "%s %2d [%11.5g, %11.5g, %11.5g] has (primal_residual, dual) values "
        "(%11.6g, %11.6g) so complementary_violation = %11.6g\n",
        is_col ? "Column" : "Row   ", is_col ? int(iVar) : int(iRow), lower,
        primal, upper, primal_residual, dual_residual, complementary_violation);
  }
  printf("PDLP max complementary violation = %g\n",
         max_complementary_violation);
  printf("     primal infeasibilities (%d, %11.6g, %11.6g)\n",
         int(num_primal_infeasibility), sum_primal_infeasibility,
         max_primal_infeasibility);
  printf("     dual   infeasibilities (%d, %11.6g, %11.6g)\n",
         int(num_dual_infeasibility), sum_dual_infeasibility,
         max_dual_infeasibility);
}